

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtk_writer.cc
# Opt level: O3

void __thiscall
lf::io::VtkWriter::WriteFieldData<float>
          (VtkWriter *this,string *name,vector<float,_std::allocator<float>_> *data)

{
  FieldData *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pfVar2;
  pointer pfVar3;
  pointer pfVar4;
  ulong uVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  pointer local_78;
  pointer pfStack_70;
  pointer local_68;
  variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>
  local_60;
  
  this_00 = &(this->vtk_file_).field_data;
  CheckAttributeSetName<std::vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>>
            (this,this_00,name);
  paVar1 = &local_98.field_2;
  local_98.field_2._M_allocated_capacity = 0;
  local_98.field_2._8_8_ = 0;
  local_98._M_string_length = 0;
  local_78 = (pointer)0x0;
  pfStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&local_98,name);
  pfVar4 = local_78;
  pfVar3 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_start;
  pfStack_70 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
               super__Vector_impl_data._M_finish;
  pfVar2 = (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data
           ._M_end_of_storage;
  (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (data->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (local_78 != (pointer)0x0) {
    uVar5 = (long)local_68 - (long)local_78;
    local_78 = pfVar3;
    local_68 = pfVar2;
    operator_delete(pfVar4,uVar5);
    pfVar3 = local_78;
    pfVar2 = local_68;
  }
  local_68 = pfVar2;
  local_78 = pfVar3;
  local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_.align_ =
       (type)((long)&local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_ + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == paVar1) {
    local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_._24_8_ = local_98.field_2._8_8_;
  }
  else {
    local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_.align_ =
         (type)local_98._M_dataplus._M_p;
  }
  local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_._16_8_ =
       local_98.field_2._M_allocated_capacity;
  local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_._8_8_ = local_98._M_string_length;
  local_98._M_string_length = 0;
  local_98.field_2._M_allocated_capacity =
       local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_._32_8_ = local_78;
  local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_._40_8_ = pfStack_70;
  local_60.storage_.super_aligned_storage_imp<56UL,_8UL>.data_._48_8_ = local_68;
  local_68 = (pointer)0x0;
  local_78 = (pointer)0x0;
  pfStack_70 = (pointer)0x0;
  local_60.which_ = 1;
  local_98._M_dataplus._M_p = (pointer)paVar1;
  std::
  vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>
  ::
  emplace_back<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>
            ((vector<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>,std::allocator<boost::variant<lf::io::VtkFile::FieldDataArray<int>,lf::io::VtkFile::FieldDataArray<float>,lf::io::VtkFile::FieldDataArray<double>>>>
              *)this_00,&local_60);
  boost::
  variant<lf::io::VtkFile::FieldDataArray<int>,_lf::io::VtkFile::FieldDataArray<float>,_lf::io::VtkFile::FieldDataArray<double>_>
  ::destroy_content(&local_60);
  if (local_78 != (pointer)0x0) {
    operator_delete(local_78,(long)local_68 - (long)local_78);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != paVar1) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void VtkWriter::WriteFieldData(const std::string& name, std::vector<T> data) {
  CheckAttributeSetName(vtk_file_.field_data, name);
  VtkFile::FieldDataArray<T> vtk_data{};
  vtk_data.name = name;
  vtk_data.data = std::move(data);
  vtk_file_.field_data.push_back(std::move(vtk_data));
}